

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O0

void Cudd_RecursiveDerefZdd(DdManager *table,DdNode *n)

{
  int iVar1;
  DdNode **ppDVar2;
  int local_34;
  int SP;
  DdNodePtr *stack;
  DdNode *pDStack_20;
  int ord;
  DdNode *N;
  DdNode *n_local;
  DdManager *table_local;
  
  ppDVar2 = table->stack;
  local_34 = 1;
  pDStack_20 = n;
  do {
    pDStack_20->ref = pDStack_20->ref - 1;
    if (pDStack_20->ref == 0) {
      table->deadZ = table->deadZ + 1;
      iVar1 = table->permZ[pDStack_20->index];
      ppDVar2[local_34] = (pDStack_20->type).kids.E;
      table->subtableZ[iVar1].dead = table->subtableZ[iVar1].dead + 1;
      pDStack_20 = (pDStack_20->type).kids.T;
      local_34 = local_34 + 1;
    }
    else {
      local_34 = local_34 + -1;
      pDStack_20 = ppDVar2[local_34];
    }
  } while (local_34 != 0);
  return;
}

Assistant:

void
Cudd_RecursiveDerefZdd(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;

    N = n;

    do {
#ifdef DD_DEBUG
        assert(N->ref != 0);
#endif

        cuddSatDec(N->ref);
    
        if (N->ref == 0) {
            table->deadZ++;
#ifdef DD_STATS
            table->nodesDropped++;
#endif
#ifdef DD_DEBUG
            assert(!cuddIsConstant(N));
#endif
            ord = table->permZ[N->index];
            stack[SP++] = cuddE(N);
            table->subtableZ[ord].dead++;
            N = cuddT(N);
        } else {
            N = stack[--SP];
        }
    } while (SP != 0);

}